

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Ssw_Cla_t *
Ssw_ClassesPrepare(Aig_Man_t *pAig,int nFramesK,int fLatchCorr,int fConstCorr,int fOutputCorr,
                  int nMaxLevs,int fVerbose)

{
  uint nFrames_00;
  int iVar1;
  Ssw_Cla_t *p_00;
  abctime aVar2;
  Ssw_Sml_t *p_01;
  long lVar3;
  abctime aVar4;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t **ppAVar7;
  undefined1 auVar8 [16];
  abctime clk;
  int local_58;
  int RetValue;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCands;
  Ssw_Sml_t *pSml;
  Ssw_Cla_t *p;
  int nIters;
  int nWords;
  int nFrames;
  int nMaxLevs_local;
  int fOutputCorr_local;
  int fConstCorr_local;
  int fLatchCorr_local;
  int nFramesK_local;
  Aig_Man_t *pAig_local;
  
  nFrames_00 = Abc_MaxInt(nFramesK,4);
  p_00 = Ssw_ClassesStart(pAig);
  p_00->fConstCorr = fConstCorr;
  aVar2 = Abc_Clock();
  p_01 = Ssw_SmlSimulateSeq(pAig,0,nFrames_00,2);
  if (fVerbose != 0) {
    iVar1 = Aig_ManObjNumMax(pAig);
    lVar3 = (long)iVar1 * (long)(int)nFrames_00 * 8;
    auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar8._0_8_ = lVar3;
    auVar8._12_4_ = 0x45300000;
    Abc_Print(1,"Allocated %.2f MB to store simulation information.\n",
              (((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 1.0) / 1048576.0);
    Abc_Print(1,"Initial simulation of %d frames with %d words.     ",(ulong)nFrames_00,2);
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  aVar2 = Abc_Clock();
  Ssw_ClassesSetData(p_00,p_01,Ssw_SmlObjHashWord,Ssw_SmlObjIsConstWord,Ssw_SmlObjsAreEqualWord);
  p_02 = Vec_PtrAlloc(1000);
  for (RetValue = 0; iVar1 = Vec_PtrSize(p_00->pAig->vObjs), RetValue < iVar1;
      RetValue = RetValue + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pAig->vObjs,RetValue);
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      if (fLatchCorr == 0) {
        iVar1 = Aig_ObjIsNode(pAVar5);
        if (((iVar1 != 0) || (iVar1 = Aig_ObjIsCi(pAVar5), iVar1 != 0)) &&
           ((nMaxLevs == 0 ||
            ((int)((uint)((ulong)*(undefined8 *)&pAVar5->field_0x18 >> 0x20) & 0xffffff) <= nMaxLevs
            )))) goto LAB_007b08e0;
      }
      else {
        iVar1 = Saig_ObjIsLo(p_00->pAig,pAVar5);
        if (iVar1 != 0) {
LAB_007b08e0:
          Vec_PtrPush(p_02,pAVar5);
        }
      }
    }
  }
  if (fOutputCorr != 0) {
    Vec_PtrClear(p_02);
    for (RetValue = 0; iVar1 = Vec_PtrSize(p_00->pAig->vObjs), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pvVar6 = Vec_PtrEntry(p_00->pAig->vObjs,RetValue);
      if (pvVar6 != (void *)0x0) {
        *(ulong *)((long)pvVar6 + 0x18) = *(ulong *)((long)pvVar6 + 0x18) & 0xffffffffffffffdf;
      }
    }
    for (RetValue = 0; iVar1 = Saig_ManPoNum(p_00->pAig), RetValue < iVar1; RetValue = RetValue + 1)
    {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pAig->vCos,RetValue);
      pObj_00 = Aig_ObjFanin0(pAVar5);
      iVar1 = Aig_ObjIsCand(pObj_00);
      if (iVar1 != 0) {
        pAVar5 = Aig_ObjFanin0(pAVar5);
        *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffdf | 0x20;
      }
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(p_00->pAig->vObjs), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pvVar6 = Vec_PtrEntry(p_00->pAig->vObjs,RetValue);
      if ((pvVar6 != (void *)0x0) && ((*(ulong *)((long)pvVar6 + 0x18) >> 5 & 1) != 0)) {
        Vec_PtrPush(p_02,pvVar6);
      }
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(p_00->pAig->vObjs), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pvVar6 = Vec_PtrEntry(p_00->pAig->vObjs,RetValue);
      if (pvVar6 != (void *)0x0) {
        *(ulong *)((long)pvVar6 + 0x18) = *(ulong *)((long)pvVar6 + 0x18) & 0xffffffffffffffdf;
      }
    }
  }
  iVar1 = Vec_PtrSize(p_02);
  ppAVar7 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
  p_00->pMemClasses = ppAVar7;
  p_00->pMemClassesFree = p_00->pMemClasses;
  Ssw_ClassesPrepareRehash(p_00,p_02,fConstCorr);
  if (fVerbose != 0) {
    Abc_Print(1,"Collecting candidate equivalence classes.        ");
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  aVar2 = Abc_Clock();
  for (RetValue = 1; RetValue < 0x10; RetValue = RetValue + 1) {
    Vec_PtrClear(p_02);
    for (local_58 = 0; iVar1 = Vec_PtrSize(p_00->pAig->vObjs), local_58 < iVar1;
        local_58 = local_58 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pAig->vObjs,local_58);
      if ((pAVar5 != (Aig_Obj_t *)0x0) &&
         (iVar1 = Ssw_ObjIsConst1Cand(p_00->pAig,pAVar5), iVar1 != 0)) {
        Vec_PtrPush(p_02,pAVar5);
      }
    }
    iVar1 = Vec_PtrSize(p_02);
    if (iVar1 != p_00->nCands1) {
      __assert_fail("Vec_PtrSize(vCands) == p->nCands1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x2b4,
                    "Ssw_Cla_t *Ssw_ClassesPrepare(Aig_Man_t *, int, int, int, int, int, int)");
    }
    Ssw_SmlResimulateSeq(p_01);
    iVar1 = Ssw_ClassesPrepareRehash(p_00,p_02,fConstCorr);
    if (iVar1 == 0) break;
  }
  Ssw_SmlStop(p_01);
  Vec_PtrFree(p_02);
  if (fVerbose != 0) {
    Abc_Print(1,"Simulation of %d frames with %d words (%2d rounds). ",(ulong)nFrames_00,2,
              (ulong)(RetValue - 1));
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  Ssw_ClassesCheck(p_00);
  return p_00;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepare( Aig_Man_t * pAig, int nFramesK, int fLatchCorr, int fConstCorr, int fOutputCorr, int nMaxLevs, int fVerbose )
{
//    int nFrames =  4;
//    int nWords  =  1;
//    int nIters  = 16;

//    int nFrames = 32;
//    int nWords  =  4;
//    int nIters  =  0;

    int nFrames =  Abc_MaxInt( nFramesK, 4 );
    int nWords  =  2;
    int nIters  = 16;
    Ssw_Cla_t * p;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObj;
    int i, k, RetValue;
    abctime clk;

    // start the classes
    p = Ssw_ClassesStart( pAig );
    p->fConstCorr = fConstCorr;

    // perform sequential simulation
clk = Abc_Clock();
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
if ( fVerbose )
{
    Abc_Print( 1, "Allocated %.2f MB to store simulation information.\n",
        1.0*(sizeof(unsigned) * Aig_ManObjNumMax(pAig) * nFrames * nWords)/(1<<20) );
    Abc_Print( 1, "Initial simulation of %d frames with %d words.     ", nFrames, nWords );
    ABC_PRT( "Time", Abc_Clock() - clk );
}

    // set comparison procedures
clk = Abc_Clock();
    Ssw_ClassesSetData( p, pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );

    // collect nodes to be considered as candidates
    vCands = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Saig_ObjIsLo(p->pAig, pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        Vec_PtrPush( vCands, pObj );
    }

    // this change will consider all PO drivers
    if ( fOutputCorr )
    {
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachPo( p->pAig, pObj, i )
            if ( Aig_ObjIsCand(Aig_ObjFanin0(pObj)) )
                Aig_ObjFanin0(pObj)->fMarkB = 1;
        Aig_ManForEachObj( p->pAig, pObj, i )
            if ( pObj->fMarkB )
                Vec_PtrPush( vCands, pObj );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_PtrSize(vCands) );
    p->pMemClassesFree = p->pMemClasses;

    // now it is time to refine the classes
    Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
if ( fVerbose )
{
    Abc_Print( 1, "Collecting candidate equivalence classes.        " );
ABC_PRT( "Time", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // perform iterative refinement using simulation
    for ( i = 1; i < nIters; i++ )
    {
        // collect const1 candidates
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, k )
            if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                Vec_PtrPush( vCands, pObj );
        assert( Vec_PtrSize(vCands) == p->nCands1 );
        // perform new round of simulation
        Ssw_SmlResimulateSeq( pSml );
        // check equivalence classes
        RetValue = Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
        if ( RetValue == 0 )
            break;
    }
    Ssw_SmlStop( pSml );
    Vec_PtrFree( vCands );
if ( fVerbose )
{
    Abc_Print( 1, "Simulation of %d frames with %d words (%2d rounds). ",
        nFrames, nWords, i-1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}